

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O0

i32_t Kumu::caldate_mjd(caldate *cd)

{
  int local_1c;
  int local_18;
  i32_t d;
  i32_t m;
  i32_t y;
  caldate *cd_local;
  
  if (cd != (caldate *)0x0) {
    local_18 = cd->month;
    d = cd->year % 400;
    if (local_18 + -1 < 2) {
      local_18 = local_18 + 9;
      d = d + -1;
    }
    else {
      local_18 = local_18 + -3;
    }
    d = local_18 / 0xc + d;
    local_18 = local_18 % 0xc;
    if (local_18 < 0) {
      local_18 = local_18 + 0xc;
      d = d + -1;
    }
    local_1c = *(int *)(montab + (long)local_18 * 4) +
               cd->day + -0xa5be2 + (cd->year / 400) * 0x23ab1 + (d / 400) * 0x23ab1;
    d = d % 400;
    if (d < 0) {
      d = d + 400;
      local_1c = local_1c + -0x23ab1;
    }
    return *(int *)(times36524 + (long)(int)((d >> 2) / 0x19 & 3) * 4) +
           *(int *)(times365 + (long)(int)(d & 3) * 4) + local_1c + ((d >> 2) % 0x19) * 0x5b5;
  }
  __assert_fail("cd",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_tai.cpp"
                ,0x71,"i32_t Kumu::caldate_mjd(const Kumu::TAI::caldate *)");
}

Assistant:

i32_t
caldate_mjd(const Kumu::TAI::caldate* cd)
{
  assert(cd);
  i32_t y, m, d;

  d = cd->day - 678882L;
  m = cd->month - 1;
  y = cd->year;

  d += 146097L * (y / 400);
  y %= 400;

  if (m >= 2) m -= 2; else { m += 10; --y; }

  y += (m / 12);
  m %= 12;
  if (m < 0) { m += 12; --y; }

  d += montab[m];

  d += 146097L * (y / 400);
  y %= 400;
  if (y < 0) { y += 400; d -= 146097L; }

  d += times365[y & 3];
  y >>= 2;

  d += 1461L * (y % 25);
  y /= 25;

  d += times36524[y & 3];

  return d;
}